

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O2

EdgeIterator * __thiscall dg::vr::Bucket::EdgeIterator::operator++(EdgeIterator *this)

{
  pointer pDVar1;
  Bucket *__args;
  reference_wrapper<dg::vr::Bucket> *prVar2;
  DirectRelIterator current;
  DirectRelIterator local_48;
  
  pDVar1 = (this->stack).
           super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __args = pDVar1[-1].current._to._M_data;
  local_48.relationIt = pDVar1[-1].relationIt;
  prVar2 = pDVar1[-1].bucketIt._M_current;
  local_48.current._from._M_data = pDVar1[-1].current._from._M_data;
  local_48.current._rel = pDVar1[-1].current._rel;
  local_48.current._12_4_ = *(undefined4 *)&pDVar1[-1].current.field_0xc;
  (this->stack).
  super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar1 + -1;
  local_48.bucketIt._M_current = prVar2 + 1;
  local_48.current._to._M_data = __args;
  std::vector<dg::vr::Bucket::DirectRelIterator,std::allocator<dg::vr::Bucket::DirectRelIterator>>::
  emplace_back<dg::vr::Bucket::DirectRelIterator&>
            ((vector<dg::vr::Bucket::DirectRelIterator,std::allocator<dg::vr::Bucket::DirectRelIterator>>
              *)&this->stack,&local_48);
  std::vector<dg::vr::Bucket::DirectRelIterator,std::allocator<dg::vr::Bucket::DirectRelIterator>>::
  emplace_back<dg::vr::Bucket_const&>
            ((vector<dg::vr::Bucket::DirectRelIterator,std::allocator<dg::vr::Bucket::DirectRelIterator>>
              *)&this->stack,__args);
  nextViableEdge(this);
  return this;
}

Assistant:

EdgeIterator &operator++() {
            DirectRelIterator current = stack.back();
            stack.pop_back();

            const Bucket &to = current->to();

            // plan return to next successor of "from" bucket
            current.inc(); // dont use ++, because incoming relation is needed
                           // on the stack
            stack.emplace_back(current);

            // plan visit to first successor of "to" bucket if unexplored so far
            stack.emplace_back(to);
            nextViableEdge();

            return *this;
        }